

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass.hpp
# Opt level: O0

Klass<Foo2,_Foo> * __thiscall
squall::Klass<Foo2,Foo>::func<void(Foo2::*)()>
          (Klass<Foo2,Foo> *this,SQChar *name,offset_in_Foo2_to_subr f)

{
  allocator local_59;
  string local_58 [32];
  offset_in_Foo2_to_subr local_38;
  offset_in_Foo2_to_subr f_local;
  SQChar *local_28;
  SQChar *name_local;
  Klass<Foo2,_Foo> *this_local;
  
  local_38 = f;
  local_28 = name;
  name_local = (SQChar *)this;
  this_local = (Klass<Foo2,_Foo> *)f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,name,&local_59);
  func<void(Foo2::*)()>(this,(string *)local_58,local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return (Klass<Foo2,_Foo> *)this;
}

Assistant:

Klass<C, Base>& func(const SQChar* name, F f) {
        func(string(name), f);
        return *this;
    }